

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O2

Vec_Ptr_t * Abc_NtkReadNodeNames(Abc_Ntk_t *pNtk,char *pFileName)

{
  FILE *__stream;
  Vec_Ptr_t *p;
  char *pcVar1;
  char *pcVar2;
  Abc_Obj_t *Entry;
  char Buffer [1000];
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    p = (Vec_Ptr_t *)0x0;
    printf("Cannot open node list \"%s\".\n",pFileName);
  }
  else {
    p = Vec_PtrAlloc(100);
    while (pcVar1 = fgets(Buffer,1000,__stream), pcVar2 = Buffer, pcVar1 != (char *)0x0) {
      while (pcVar2 = strtok(pcVar2," \n\r\t"), pcVar2 != (char *)0x0) {
        Entry = Abc_NtkFindNode(pNtk,pcVar2);
        if (Entry == (Abc_Obj_t *)0x0) {
          printf("Cannot find node \"%s\".\n",pcVar2);
          Vec_PtrFree(p);
          fclose(__stream);
          return (Vec_Ptr_t *)0x0;
        }
        Vec_PtrPush(p,Entry);
        pcVar2 = (char *)0x0;
      }
    }
    fclose(__stream);
  }
  return p;
}

Assistant:

Vec_Ptr_t * Abc_NtkReadNodeNames( Abc_Ntk_t * pNtk, char * pFileName )
{
    char Buffer[1000];
    Vec_Ptr_t * vNodes = NULL;
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open node list \"%s\".\n", pFileName );
        return NULL;
    }
    vNodes = Vec_PtrAlloc( 100 );
    while ( fgets(Buffer, 1000, pFile) != NULL ) 
    {
        char * pToken = strtok( Buffer, " \n\r\t" );
        while ( pToken )
        {
            Abc_Obj_t * pObj = Abc_NtkFindNode( pNtk, pToken );
            if ( pObj == NULL )
            {
                printf( "Cannot find node \"%s\".\n", pToken );
                Vec_PtrFree( vNodes );
                fclose( pFile );
                return NULL;
            }
            Vec_PtrPush( vNodes, pObj );
            pToken = strtok( NULL, " \n\r\t" );
        }
    }
    fclose( pFile );
    return vNodes;
}